

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

array_container_t * array_container_clone(array_container_t *src)

{
  array_container_t *paVar1;
  
  paVar1 = array_container_create_given_capacity(src->capacity);
  if (paVar1 == (array_container_t *)0x0) {
    paVar1 = (array_container_t *)0x0;
  }
  else {
    paVar1->cardinality = src->cardinality;
    memcpy(paVar1->array,src->array,(long)src->cardinality * 2);
  }
  return paVar1;
}

Assistant:

ALLOW_UNALIGNED
array_container_t *array_container_clone(const array_container_t *src) {
    array_container_t *newcontainer =
        array_container_create_given_capacity(src->capacity);
    if (newcontainer == NULL) return NULL;

    newcontainer->cardinality = src->cardinality;

    memcpy(newcontainer->array, src->array,
           src->cardinality * sizeof(uint16_t));

    return newcontainer;
}